

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O3

Var Js::BoundFunction::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  RecyclableObject *obj;
  undefined8 uVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  BOOL BVar7;
  uint uVar8;
  undefined4 *puVar9;
  FunctionInfo *pFVar10;
  Recycler *this;
  char *addr;
  Var pvVar11;
  JavascriptMethod entryPoint;
  Type *pTVar12;
  uint count;
  CallFlags flag;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  size_t size;
  char *addr_00;
  uint in_stack_00000010;
  Type *in_stack_00000018;
  undefined1 local_c0 [8];
  TrackAllocData data;
  undefined1 local_80 [8];
  Arguments args;
  Type *local_40;
  
  uVar13 = callInfo._0_4_;
  if (in_stack_00000010 != uVar13) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x67,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b25fd4;
    *puVar9 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_80 = (undefined1  [8])callInfo;
  if (((ulong)callInfo & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  obj = (RecyclableObject *)
        function[3].super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject;
  flag = callInfo._3_4_ &
         (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
          CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New);
  if ((uVar13 >> 0x18 & 1) == 0) {
    uVar15 = *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject;
    if (uVar15 == 0) {
      in_stack_00000018 = function[3].type.ptr;
      local_40 = (Type *)0x0;
      goto LAB_00b25f5f;
    }
    local_40 = (Type *)0x0;
  }
  else {
    if ((uVar13 >> 0x1e & 1) == 0) {
      bVar4 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
      if (bVar4) {
        in_stack_00000018 = (Type *)0x0;
        pTVar12 = in_stack_00000018;
      }
      else {
        pTVar2 = scriptContext->threadContext;
        bVar4 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        pTVar12 = (Type *)JavascriptOperators::NewScObjectNoCtor(obj,scriptContext);
        pTVar2->reentrancySafeOrHandled = bVar4;
      }
    }
    else {
      pvVar11 = CallInfo::GetNewTarget(flag,&stack0x00000018,uVar13 & 0xffffff);
      bVar4 = JavascriptOperators::IsConstructor(pvVar11);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                    ,0x7d,"(JavascriptOperators::IsConstructor(newTargetVar))",
                                    "newTarget must be a constructor");
        if (!bVar4) goto LAB_00b25fd4;
        *puVar9 = 0;
      }
      pTVar12 = (Type *)UnsafeVarTo<Js::RecyclableObject>(pvVar11);
      pFVar10 = JavascriptOperators::GetConstructorFunctionInfo(obj,scriptContext);
      if ((pFVar10 == (FunctionInfo *)0x0) || ((pFVar10->attributes & ClassConstructor) == None)) {
        pTVar2 = scriptContext->threadContext;
        bVar4 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        pTVar12 = (Type *)JavascriptOperators::CreateFromConstructor
                                    ((RecyclableObject *)pTVar12,scriptContext);
        pTVar2->reentrancySafeOrHandled = bVar4;
      }
    }
    in_stack_00000018 = pTVar12;
    uVar15 = *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject;
    local_40 = in_stack_00000018;
    if (uVar15 == 0) goto LAB_00b25f5f;
  }
  args.Values = (Type)(function + 4);
  count = uVar13 & 0xffffff;
  uVar5 = CallInfo::GetLargeArgCountWithExtraArgs(flag,count);
  uVar6 = uVar5 + uVar15;
  if (CARRY4(uVar5,uVar15)) {
    ::Math::DefaultOverflowPolicy();
  }
  if (0xffffff < uVar6) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec52,(PCWSTR)0x0);
  }
  local_c0 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_5f6a7be;
  data.filename._0_4_ = 0xb0;
  data.plusSize = (ulong)uVar6;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_c0);
  BVar7 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00b25fd4;
    *puVar9 = 0;
  }
  size = (ulong)uVar6 << 3;
  addr = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,size);
  if (addr == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00b25fd4;
    *puVar9 = 0;
  }
  memset(addr,0,size);
  if ((uVar13 >> 0x18 & 1) == 0) {
    pTVar12 = function[3].type.ptr;
  }
  else {
    pTVar12 = (Type *)Arguments::operator[]((Arguments *)local_80,0);
  }
  Memory::Recycler::WBSetBit(addr);
  *(Type **)addr = pTVar12;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (*(int *)args.Values == 0) {
    uVar5 = 1;
  }
  else {
    uVar14 = 0;
    addr_00 = addr;
    do {
      addr_00 = addr_00 + 8;
      uVar1 = *(undefined8 *)(&(function[4].type.ptr)->typeId + uVar14 * 2);
      Memory::Recycler::WBSetBit(addr_00);
      *(undefined8 *)addr_00 = uVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject);
    uVar5 = (int)uVar14 + 1;
  }
  if (1 < count) {
    uVar15 = 1;
    do {
      uVar14 = (ulong)((uVar15 + uVar5) - 1);
      pvVar11 = Arguments::operator[]((Arguments *)local_80,uVar15);
      Memory::Recycler::WBSetBit(addr + uVar14 * 8);
      *(Var *)(addr + uVar14 * 8) = pvVar11;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr + uVar14 * 8);
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
    uVar5 = (uVar5 + uVar15) - 1;
  }
  bVar4 = CallInfo::HasExtraArg((uint)local_80[3]);
  if (bVar4) {
    uVar1 = *(undefined8 *)((long)args.Info + ((ulong)callInfo & 0xffffff) * 8);
    uVar14 = (ulong)uVar5;
    uVar5 = uVar5 + 1;
    Memory::Recycler::WBSetBit(addr + uVar14 * 8);
    *(undefined8 *)(addr + uVar14 * 8) = uVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr + uVar14 * 8);
  }
  callInfo = (CallInfo)
             ((ulong)local_80 & 0xffffffffff000000 |
             (ulong)(*(int *)args.Values + uVar13 & 0xffffff));
  uVar8 = CallInfo::GetLargeArgCountWithExtraArgs
                    (local_80._3_4_ &
                     (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                      CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                     CallFlags_New),callInfo._0_4_ & 0xffffff);
  if (uVar5 != uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0xd3,"(index == actualArgs.GetLargeArgCountWithExtraArgs())",
                                "index == actualArgs.GetLargeArgCountWithExtraArgs()");
    if (!bVar4) {
LAB_00b25fd4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
LAB_00b25f5f:
  pTVar2 = scriptContext->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  entryPoint = RecyclableObject::GetEntryPoint(obj);
  data._32_8_ = callInfo;
  pTVar12 = (Type *)JavascriptFunction::CallFunction<true>
                              (obj,entryPoint,(Arguments *)&data.line,true);
  pTVar2->reentrancySafeOrHandled = bVar4;
  if (((uVar13 >> 0x18 & 1) != 0) && (BVar7 = JavascriptOperators::IsObject(pTVar12), BVar7 == 0)) {
    pTVar12 = local_40;
  }
  return pTVar12;
}

Assistant:

Var BoundFunction::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction /* TODO-ERROR: get arg name - args[0] */);
        }

        BoundFunction *boundFunction = (BoundFunction *) function;
        RecyclableObject *targetFunction = boundFunction->targetFunction;

        //
        // var o = new boundFunction()
        // a new object should be created using the actual function object
        //
        Var newVarInstance = nullptr;
        if (callInfo.Flags & CallFlags_New)
        {
            if (args.HasNewTarget())
            {
                // target has an overridden new target make a new object from the newTarget
                Var newTargetVar = args.GetNewTarget();
                AssertOrFailFastMsg(JavascriptOperators::IsConstructor(newTargetVar), "newTarget must be a constructor");
                RecyclableObject* newTarget = UnsafeVarTo<RecyclableObject>(newTargetVar);

                // Class constructors expect newTarget to be in args slot 0 (usually "this"),
                // because "this" is not constructed until we reach the most-super superclass.
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetFunction, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    args.Values[0] = newVarInstance = newTarget;
                }
                else
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        args.Values[0] = newVarInstance = JavascriptOperators::CreateFromConstructor(newTarget, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
            else if (!VarIs<JavascriptProxy>(targetFunction))
            {
                // No new target and target is not a proxy can make a new object in a "normal" way.
                // NewScObjectNoCtor will either construct an object or return targetFunction depending
                // on whether targetFunction is a class constructor.
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    args.Values[0] = newVarInstance = JavascriptOperators::NewScObjectNoCtor(targetFunction, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }
            else
            {
                // target is a proxy without an overridden new target
                // give nullptr - FunctionCallTrap will make a new object
                args.Values[0] = newVarInstance;
            }
        }

        Js::Arguments actualArgs = args;

        if (boundFunction->count > 0)
        {
            // OACR thinks that this can change between here and the check in the for loop below
            const unsigned int argCount = args.Info.Count;

            uint32 newArgCount = UInt32Math::Add(boundFunction->count, args.GetLargeArgCountWithExtraArgs());
            if (newArgCount > CallInfo::kMaxCountArgs)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            Field(Var) *newValues = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), newArgCount);
            uint index = 0;

            //
            // For [[Construct]] use the newly created var instance
            // For [[Call]] use the "this" to which bind bound it.
            //
            if (callInfo.Flags & CallFlags_New)
            {
                newValues[index++] = args[0];
            }
            else
            {
                newValues[index++] = boundFunction->boundThis;
            }

            for (uint i = 0; i < boundFunction->count; i++)
            {
                newValues[index++] = boundFunction->boundArgs[i];
            }

            // Copy the extra args
            for (uint i=1; i<argCount; i++)
            {
                newValues[index++] = args[i];
            }

            if (args.HasExtraArg())
            {
                newValues[index++] = args.Values[argCount];
            }

            actualArgs = Arguments(args.Info, unsafe_write_barrier_cast<Var*>(newValues));
            actualArgs.Info.Count = boundFunction->count + argCount;

            Assert(index == actualArgs.GetLargeArgCountWithExtraArgs());
        }
        else
        {
            if (!(callInfo.Flags & CallFlags_New))
            {
                actualArgs.Values[0] = boundFunction->boundThis;
            }
        }

        Var aReturnValue = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the larger argcount logic for this call.
            aReturnValue = JavascriptFunction::CallFunction<true>(targetFunction, targetFunction->GetEntryPoint(), actualArgs, /* useLargeArgCount */ true);
        }
        END_SAFE_REENTRANT_CALL

        //
        // [[Construct]] and call returned a non-object
        // return the newly created var instance
        //
        if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
        {
            aReturnValue = newVarInstance;
        }

        return aReturnValue;
    }